

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

void ImGui::ShadeVertsLinearColorGradientKeepAlpha
               (ImDrawList *draw_list,int vert_start_idx,int vert_end_idx,ImVec2 gradient_p0,
               ImVec2 gradient_p1,ImU32 col0,ImU32 col1)

{
  ImDrawVert *pIVar1;
  bool bVar2;
  undefined1 auVar3 [16];
  ulong uVar4;
  undefined8 uVar5;
  undefined1 auVar6 [16];
  byte bVar7;
  byte bVar8;
  long lVar9;
  ImDrawVert *pIVar10;
  long lVar11;
  ulong uVar12;
  ImDrawVert *pIVar13;
  ulong uVar14;
  uint uVar15;
  long unaff_R14;
  ushort uVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  undefined1 auVar35 [64];
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  undefined1 auVar39 [16];
  undefined1 in_register_00001208 [56];
  undefined1 in_register_00001248 [56];
  undefined1 auVar40 [16];
  undefined1 in_ZMM6 [64];
  undefined1 auVar41 [16];
  undefined1 in_ZMM7 [64];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 in_ZMM22 [64];
  undefined1 auVar38 [64];
  
  auVar19._8_56_ = in_register_00001248;
  auVar19._0_8_ = gradient_p1;
  auVar18._8_56_ = in_register_00001208;
  auVar18._0_8_ = gradient_p0;
  if (vert_start_idx < vert_end_idx) {
    auVar39 = auVar18._0_16_;
    auVar3 = vsubps_avx(auVar19._0_16_,auVar39);
    auVar17 = vmovshdup_avx(auVar3);
    auVar6 = vfmadd231ss_fma(ZEXT416((uint)(auVar17._0_4_ * auVar17._0_4_)),auVar3,auVar3);
    lVar9 = (long)vert_start_idx;
    pIVar1 = (draw_list->VtxBuffer).Data;
    pIVar13 = pIVar1 + lVar9;
    pIVar10 = pIVar1 + vert_end_idx;
    if (pIVar1 + vert_end_idx < pIVar1 + lVar9 + 1) {
      pIVar10 = pIVar1 + lVar9 + 1;
    }
    lVar11 = (long)pIVar10 + (-0x14 - (long)pIVar1);
    uVar14 = (ulong)(lVar11 != lVar9 * 0x14);
    uVar15 = col0 >> 0x10 & 0xff;
    auVar44._0_4_ = (float)(int)((col1 >> 0x10 & 0xff) - uVar15);
    auVar40._4_12_ = in_ZMM6._4_12_;
    auVar44._4_12_ = auVar40._4_12_;
    auVar45._0_4_ = (float)uVar15;
    auVar45._4_12_ = auVar40._4_12_;
    uVar15 = col0 >> 8 & 0xff;
    auVar42._0_4_ = (float)(int)((col1 >> 8 & 0xff) - uVar15);
    auVar42._4_12_ = auVar40._4_12_;
    auVar43._0_4_ = (float)uVar15;
    auVar43._4_12_ = auVar40._4_12_;
    auVar40._0_4_ = (float)(int)((col1 & 0xff) - (col0 & 0xff));
    auVar41._0_4_ = (float)(col0 & 0xff);
    auVar41._4_12_ = in_ZMM7._4_12_;
    auVar18 = vpbroadcastq_avx512f();
    auVar19 = vbroadcastss_avx512f(auVar39);
    auVar39 = vmovshdup_avx(auVar39);
    auVar20 = vbroadcastsd_avx512f(auVar39);
    auVar21 = vbroadcastsd_avx512f(auVar17);
    auVar22 = vbroadcastss_avx512f(auVar3);
    auVar23 = vbroadcastss_avx512f(ZEXT416((uint)(1.0 / auVar6._0_4_)));
    auVar24 = vbroadcastss_avx512f(auVar40);
    auVar25 = vbroadcastss_avx512f(auVar41);
    auVar26 = vbroadcastss_avx512f(auVar42);
    auVar27 = vbroadcastss_avx512f(auVar43);
    auVar28 = vbroadcastss_avx512f(auVar44);
    auVar29 = vbroadcastss_avx512f(auVar45);
    uVar12 = 0;
    auVar30 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar31 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    auVar32 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
    vpmovsxwd_avx512f(_DAT_0054a280);
    auVar33 = vpbroadcastd_avx512f(ZEXT416(0xff000000));
    do {
      auVar34 = vpbroadcastq_avx512f();
      auVar35 = vporq_avx512f(auVar34,auVar30);
      auVar34 = vporq_avx512f(auVar34,auVar31);
      uVar5 = vpcmpuq_avx512f(auVar34,auVar18,2);
      bVar7 = (byte)uVar5;
      uVar5 = vpcmpuq_avx512f(auVar35,auVar18,2);
      bVar8 = (byte)uVar5;
      uVar16 = CONCAT11(bVar8,bVar7);
      auVar17 = vpxord_avx512vl(auVar34._0_16_,auVar34._0_16_);
      auVar34 = vgatherdps_avx512f(*(undefined4 *)((long)&(pIVar13->pos).x + unaff_R14));
      auVar36._0_4_ = (uint)(bVar7 & 1) * auVar34._0_4_ | (uint)!(bool)(bVar7 & 1) * auVar17._0_4_;
      bVar2 = (bool)((byte)(uVar16 >> 1) & 1);
      auVar36._4_4_ = (uint)bVar2 * auVar34._4_4_ | (uint)!bVar2 * auVar17._4_4_;
      bVar2 = (bool)((byte)(uVar16 >> 2) & 1);
      auVar36._8_4_ = (uint)bVar2 * auVar34._8_4_ | (uint)!bVar2 * auVar17._8_4_;
      bVar2 = (bool)((byte)(uVar16 >> 3) & 1);
      auVar36._12_4_ = (uint)bVar2 * auVar34._12_4_ | (uint)!bVar2 * auVar17._12_4_;
      auVar36._16_4_ = (uint)((byte)(uVar16 >> 4) & 1) * auVar34._16_4_;
      auVar36._20_4_ = (uint)((byte)(uVar16 >> 5) & 1) * auVar34._20_4_;
      auVar36._24_4_ = (uint)((byte)(uVar16 >> 6) & 1) * auVar34._24_4_;
      auVar36._28_4_ = (uint)((byte)(uVar16 >> 7) & 1) * auVar34._28_4_;
      auVar36._32_4_ = (uint)(bVar8 & 1) * auVar34._32_4_;
      auVar36._36_4_ = (uint)(bVar8 >> 1 & 1) * auVar34._36_4_;
      auVar36._40_4_ = (uint)(bVar8 >> 2 & 1) * auVar34._40_4_;
      auVar36._44_4_ = (uint)(bVar8 >> 3 & 1) * auVar34._44_4_;
      auVar36._48_4_ = (uint)(bVar8 >> 4 & 1) * auVar34._48_4_;
      auVar36._52_4_ = (uint)(bVar8 >> 5 & 1) * auVar34._52_4_;
      auVar36._56_4_ = (uint)(bVar8 >> 6 & 1) * auVar34._56_4_;
      auVar36._60_4_ = (uint)(bVar8 >> 7) * auVar34._60_4_;
      auVar34 = vsubps_avx512f(auVar36,auVar19);
      auVar17 = vpxord_avx512vl(auVar35._0_16_,auVar35._0_16_);
      auVar35 = vgatherdps_avx512f(*(undefined4 *)((long)&(pIVar13->pos).y + unaff_R14));
      auVar37._0_4_ = (uint)(bVar7 & 1) * auVar35._0_4_ | (uint)!(bool)(bVar7 & 1) * auVar17._0_4_;
      bVar2 = (bool)((byte)(uVar16 >> 1) & 1);
      auVar37._4_4_ = (uint)bVar2 * auVar35._4_4_ | (uint)!bVar2 * auVar17._4_4_;
      bVar2 = (bool)((byte)(uVar16 >> 2) & 1);
      auVar37._8_4_ = (uint)bVar2 * auVar35._8_4_ | (uint)!bVar2 * auVar17._8_4_;
      bVar2 = (bool)((byte)(uVar16 >> 3) & 1);
      auVar37._12_4_ = (uint)bVar2 * auVar35._12_4_ | (uint)!bVar2 * auVar17._12_4_;
      auVar37._16_4_ = (uint)((byte)(uVar16 >> 4) & 1) * auVar35._16_4_;
      auVar37._20_4_ = (uint)((byte)(uVar16 >> 5) & 1) * auVar35._20_4_;
      auVar37._24_4_ = (uint)((byte)(uVar16 >> 6) & 1) * auVar35._24_4_;
      auVar37._28_4_ = (uint)((byte)(uVar16 >> 7) & 1) * auVar35._28_4_;
      auVar37._32_4_ = (uint)(bVar8 & 1) * auVar35._32_4_;
      auVar37._36_4_ = (uint)(bVar8 >> 1 & 1) * auVar35._36_4_;
      auVar37._40_4_ = (uint)(bVar8 >> 2 & 1) * auVar35._40_4_;
      auVar37._44_4_ = (uint)(bVar8 >> 3 & 1) * auVar35._44_4_;
      auVar37._48_4_ = (uint)(bVar8 >> 4 & 1) * auVar35._48_4_;
      auVar37._52_4_ = (uint)(bVar8 >> 5 & 1) * auVar35._52_4_;
      auVar37._56_4_ = (uint)(bVar8 >> 6 & 1) * auVar35._56_4_;
      auVar37._60_4_ = (uint)(bVar8 >> 7) * auVar35._60_4_;
      auVar35 = vsubps_avx512f(auVar37,auVar20);
      auVar35 = vmulps_avx512f(auVar21,auVar35);
      auVar34 = vfmadd231ps_avx512f(auVar35,auVar22,auVar34);
      auVar34 = vmulps_avx512f(auVar23,auVar34);
      uVar4 = vcmpps_avx512f(auVar34,ZEXT1664(ZEXT816(0) << 0x40),5);
      auVar35 = vminps_avx512f(auVar32,auVar34);
      auVar34._4_4_ = (uint)((byte)(uVar4 >> 1) & 1) * auVar35._4_4_;
      auVar34._0_4_ = (uint)((byte)uVar4 & 1) * auVar35._0_4_;
      auVar34._8_4_ = (uint)((byte)(uVar4 >> 2) & 1) * auVar35._8_4_;
      auVar34._12_4_ = (uint)((byte)(uVar4 >> 3) & 1) * auVar35._12_4_;
      auVar34._16_4_ = (uint)((byte)(uVar4 >> 4) & 1) * auVar35._16_4_;
      auVar34._20_4_ = (uint)((byte)(uVar4 >> 5) & 1) * auVar35._20_4_;
      auVar34._24_4_ = (uint)((byte)(uVar4 >> 6) & 1) * auVar35._24_4_;
      auVar34._28_4_ = (uint)((byte)(uVar4 >> 7) & 1) * auVar35._28_4_;
      auVar34._32_4_ = (uint)((byte)(uVar4 >> 8) & 1) * auVar35._32_4_;
      auVar34._36_4_ = (uint)((byte)(uVar4 >> 9) & 1) * auVar35._36_4_;
      auVar34._40_4_ = (uint)((byte)(uVar4 >> 10) & 1) * auVar35._40_4_;
      auVar34._44_4_ = (uint)((byte)(uVar4 >> 0xb) & 1) * auVar35._44_4_;
      auVar34._48_4_ = (uint)((byte)(uVar4 >> 0xc) & 1) * auVar35._48_4_;
      auVar34._52_4_ = (uint)((byte)(uVar4 >> 0xd) & 1) * auVar35._52_4_;
      auVar34._56_4_ = (uint)((byte)(uVar4 >> 0xe) & 1) * auVar35._56_4_;
      auVar34._60_4_ = (uint)(byte)(uVar4 >> 0xf) * auVar35._60_4_;
      auVar35 = vfmadd213ps_avx512f(auVar34,auVar24,auVar25);
      auVar35 = vcvttps2dq_avx512f(auVar35);
      auVar36 = vfmadd213ps_avx512f(auVar34,auVar26,auVar27);
      auVar36 = vcvttps2dq_avx512f(auVar36);
      auVar34 = vfmadd213ps_avx512f(auVar34,auVar28,auVar29);
      auVar34 = vcvttps2dq_avx512f(auVar34);
      auVar36 = vpslld_avx512f(auVar36,8);
      auVar34 = vpslld_avx512f(auVar34,0x10);
      auVar17 = vpxord_avx512vl(in_ZMM22._0_16_,in_ZMM22._0_16_);
      auVar37 = vpgatherdd_avx512f(*(undefined4 *)((long)&(pIVar13->pos).x + uVar12));
      auVar38._0_4_ = (uint)(bVar7 & 1) * auVar37._0_4_ | (uint)!(bool)(bVar7 & 1) * auVar17._0_4_;
      bVar2 = (bool)((byte)(uVar16 >> 1) & 1);
      auVar38._4_4_ = (uint)bVar2 * auVar37._4_4_ | (uint)!bVar2 * auVar17._4_4_;
      bVar2 = (bool)((byte)(uVar16 >> 2) & 1);
      auVar38._8_4_ = (uint)bVar2 * auVar37._8_4_ | (uint)!bVar2 * auVar17._8_4_;
      bVar2 = (bool)((byte)(uVar16 >> 3) & 1);
      auVar38._12_4_ = (uint)bVar2 * auVar37._12_4_ | (uint)!bVar2 * auVar17._12_4_;
      auVar38._16_4_ = (uint)((byte)(uVar16 >> 4) & 1) * auVar37._16_4_;
      auVar38._20_4_ = (uint)((byte)(uVar16 >> 5) & 1) * auVar37._20_4_;
      auVar38._24_4_ = (uint)((byte)(uVar16 >> 6) & 1) * auVar37._24_4_;
      auVar38._28_4_ = (uint)((byte)(uVar16 >> 7) & 1) * auVar37._28_4_;
      auVar38._32_4_ = (uint)(bVar8 & 1) * auVar37._32_4_;
      auVar38._36_4_ = (uint)(bVar8 >> 1 & 1) * auVar37._36_4_;
      auVar38._40_4_ = (uint)(bVar8 >> 2 & 1) * auVar37._40_4_;
      auVar38._44_4_ = (uint)(bVar8 >> 3 & 1) * auVar37._44_4_;
      auVar38._48_4_ = (uint)(bVar8 >> 4 & 1) * auVar37._48_4_;
      auVar38._52_4_ = (uint)(bVar8 >> 5 & 1) * auVar37._52_4_;
      auVar38._56_4_ = (uint)(bVar8 >> 6 & 1) * auVar37._56_4_;
      auVar38._60_4_ = (uint)(bVar8 >> 7) * auVar37._60_4_;
      auVar35 = vpternlogd_avx512f(auVar38,auVar35,auVar33,0xec);
      in_ZMM22 = vpternlogd_avx512f(auVar35,auVar34,auVar36,0xfe);
      vpscatterdd_avx512f(ZEXT864(pIVar13) + auVar18,(ulong)uVar16,in_ZMM22);
      uVar12 = uVar12 + 0x10;
      pIVar13 = pIVar13 + 0x10;
    } while ((((lVar11 - uVar14) + lVar9 * -0x14) / 0x14 + 0x10 + uVar14 & 0xfffffffffffffff0) !=
             uVar12);
  }
  return;
}

Assistant:

void ImGui::ShadeVertsLinearColorGradientKeepAlpha(ImDrawList* draw_list, int vert_start_idx, int vert_end_idx, ImVec2 gradient_p0, ImVec2 gradient_p1, ImU32 col0, ImU32 col1)
{
    ImVec2 gradient_extent = gradient_p1 - gradient_p0;
    float gradient_inv_length2 = 1.0f / ImLengthSqr(gradient_extent);
    ImDrawVert* vert_start = draw_list->VtxBuffer.Data + vert_start_idx;
    ImDrawVert* vert_end = draw_list->VtxBuffer.Data + vert_end_idx;
    const int col0_r = (int)(col0 >> IM_COL32_R_SHIFT) & 0xFF;
    const int col0_g = (int)(col0 >> IM_COL32_G_SHIFT) & 0xFF;
    const int col0_b = (int)(col0 >> IM_COL32_B_SHIFT) & 0xFF;
    const int col_delta_r = ((int)(col1 >> IM_COL32_R_SHIFT) & 0xFF) - col0_r;
    const int col_delta_g = ((int)(col1 >> IM_COL32_G_SHIFT) & 0xFF) - col0_g;
    const int col_delta_b = ((int)(col1 >> IM_COL32_B_SHIFT) & 0xFF) - col0_b;
    for (ImDrawVert* vert = vert_start; vert < vert_end; vert++)
    {
        float d = ImDot(vert->pos - gradient_p0, gradient_extent);
        float t = ImClamp(d * gradient_inv_length2, 0.0f, 1.0f);
        int r = (int)(col0_r + col_delta_r * t);
        int g = (int)(col0_g + col_delta_g * t);
        int b = (int)(col0_b + col_delta_b * t);
        vert->col = (r << IM_COL32_R_SHIFT) | (g << IM_COL32_G_SHIFT) | (b << IM_COL32_B_SHIFT) | (vert->col & IM_COL32_A_MASK);
    }
}